

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O2

void LP_dgefa(double *a,int lda,int n,int *ipvt,int *info)

{
  long lVar1;
  double dVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  
  *info = 0;
  uVar4 = n - 1;
  if (0 < n) {
    lVar6 = (long)lda;
    lVar1 = lVar6 * 8;
    iVar12 = 1;
    lVar11 = lVar1;
    lVar15 = lVar1;
    for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
      lVar7 = uVar14 * lVar6;
      pdVar10 = a + lVar7 + uVar14;
      iVar13 = (int)uVar14;
      iVar5 = LP_idamax(n - iVar13,pdVar10,1);
      iVar8 = iVar5 + iVar13;
      ipvt[uVar14] = iVar8;
      dVar2 = a[lVar7 + iVar8];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        if (iVar5 != 0) {
          a[lVar7 + iVar8] = *pdVar10;
          *pdVar10 = dVar2;
        }
        lVar7 = lVar11 + (long)(iVar5 + iVar13) * 8;
        pdVar10 = a;
        for (lVar9 = (long)iVar12; lVar9 < (long)(ulong)(uint)n; lVar9 = lVar9 + 1) {
          if (iVar5 != 0) {
            uVar3 = *(undefined8 *)((long)pdVar10 + lVar7);
            *(undefined8 *)((long)pdVar10 + lVar7) = *(undefined8 *)((long)pdVar10 + lVar15);
            *(undefined8 *)((long)pdVar10 + lVar15) = uVar3;
          }
          pdVar10 = pdVar10 + lVar6;
        }
      }
      else {
        *info = iVar13;
      }
      iVar12 = iVar12 + 1;
      lVar15 = lVar15 + lVar6 * 8 + 8;
      lVar11 = lVar11 + lVar1;
    }
  }
  ipvt[(int)uVar4] = uVar4;
  if ((a[(int)((lda + 1) * uVar4)] == 0.0) && (!NAN(a[(int)((lda + 1) * uVar4)]))) {
    *info = uVar4;
  }
  return;
}

Assistant:

void LP_dgefa(a,lda,n,ipvt,info)
REAL a[];
int lda,n,ipvt[],*info;

/* We would like to declare a[][lda], but c does not allow it.  In this
function, references to a[i][j] are written a[lda*i+j].  */
/*
     LP_dgefa factors a double precision matrix by gaussian elimination.

     LP_dgefa is usually called by dgeco, but it can be called
     directly with a saving in time if  rcond  is not needed.
     (time for dgeco) = (1 + 9/n)*(time for LP_dgefa) .

     on entry

        a       REAL precision[n][lda]
                the matrix to be factored.

        lda     integer
                the leading dimension of the array  a .

        n       integer
                the order of the matrix  a .

     on return

        a       an upper triangular matrix and the multipliers
                which were used to obtain it.
                the factorization can be written  a = l*u  where
                l  is a product of permutation and unit lower
                triangular matrices and  u  is upper triangular.

        ipvt    integer[n]
                an integer vector of pivot indices.

        info    integer
                = 0  normal value.
                = k  if  u[k][k] .eq. 0.0 .  this is not an error
                     condition for this subroutine, but it does
                     indicate that LP_dgesl or dgedi will divide by zero
                     if called.  use  rcond  in dgeco for a reliable
                     indication of singularity.

     linpack. this version dated 08/14/78 .
     cleve moler, university of new mexico, argonne national lab.

     functions

     blas LP_daxpy,LP_dscal,LP_idamax
*/

{
/*     internal variables	*/

  REAL t;
  int j,k,kp1,l,nm1;


/*     gaussian elimination with partial pivoting	*/
	*info = 0;
	nm1 = n - 1;
	if (nm1 >=  0) {
		for (k = 0; k < nm1; k++) {
			kp1 = k + 1;

          		/* find l = pivot index	*/

			l = LP_idamax(n-k,&a[lda*k+k],1) + k;
			ipvt[k] = l;

			/* zero pivot implies this column already 
			   triangularized */
			if (a[lda*k+l] != ZERO) {

				/* interchange if necessary */

				if (l != k) {
					t = a[lda*k+l];
					a[lda*k+l] = a[lda*k+k];
					a[lda*k+k] = t; 
				}

				/* compute multipliers */

				t = -ONE/a[lda*k+k];
				LP_dscal(n-(k+1),t,&a[lda*k+k+1],1);

				/* row elimination with column indexing */

				for (j = kp1; j < n; j++) {
					t = a[lda*j+l];
					if (l != k) {
						a[lda*j+l] = a[lda*j+k];
						a[lda*j+k] = t;
					}
					LP_daxpy(n-(k+1),t,&a[lda*k+k+1],1,
					      &a[lda*j+k+1],1);
  				} 
  			}
			else { 
            			*info = k;
			}
		} 
	}
	ipvt[n-1] = n-1;
	if (a[lda*(n-1)+(n-1)] == ZERO) *info = n-1;
}